

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_log>(Mat *a,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [24];
  long *in_RDI;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_log op;
  Mat *m;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf y_1;
  v4sf z_1;
  v4sf tmp_1;
  v4sf mask_1;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_1;
  v4si emm0;
  undefined8 local_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  int local_173c;
  undefined8 local_1738;
  undefined8 local_1730;
  undefined8 local_1728;
  undefined4 local_1720;
  long local_1718;
  undefined4 local_1710;
  undefined4 local_170c;
  undefined4 local_1708;
  undefined4 local_1704;
  undefined4 local_1700;
  undefined8 local_16f8;
  undefined1 (*local_16f0) [32];
  int local_16e8;
  int local_16e4;
  int local_16e0;
  int local_16dc;
  int local_16d8;
  int local_16d4;
  int local_16d0;
  undefined1 local_16c9 [9];
  long *local_16c0;
  undefined1 local_16b5;
  int local_16b4;
  undefined8 *local_16a8;
  undefined8 *local_16a0;
  undefined8 *local_1690;
  undefined1 (*local_1688) [32];
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined1 (*local_1650) [32];
  undefined1 (*local_1648) [32];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined1 (*local_1630) [32];
  long local_1628;
  undefined4 local_161c;
  long local_1618;
  undefined1 (*local_1610) [32];
  undefined4 local_1604;
  int local_1600;
  int local_15fc;
  undefined8 *local_15f8;
  undefined4 local_15ec;
  long local_15e8;
  undefined8 *local_15d8;
  undefined8 *local_15b0;
  undefined1 *local_15a8;
  undefined8 *local_15a0;
  undefined1 *local_1598;
  undefined1 (*local_1590) [32];
  undefined1 *local_1588;
  undefined1 local_1580 [8];
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  float fStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [8];
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined1 local_14e0 [32];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined1 local_1480 [8];
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined1 *local_11f8;
  float *local_11f0;
  undefined1 *local_11e8;
  float local_11e0 [2];
  float afStack_11d8 [2];
  float afStack_11d0 [2];
  float afStack_11c8 [2];
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 *local_1198;
  float *local_1190;
  undefined1 *local_1188;
  float local_1180 [2];
  float afStack_1178 [2];
  float afStack_1170 [2];
  float afStack_1168 [2];
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  float *local_1138;
  undefined1 *local_1130;
  undefined1 *local_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  undefined4 uStack_10e4;
  float *local_10d8;
  undefined1 *local_10d0;
  undefined1 *local_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  undefined4 uStack_1084;
  float *local_1078;
  undefined1 *local_1070;
  undefined1 *local_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  float *local_1018;
  undefined1 *local_1010;
  undefined1 *local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  undefined4 uStack_fc4;
  float *local_fb8;
  undefined1 *local_fb0;
  undefined1 *local_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float fStack_f70;
  float fStack_f6c;
  float fStack_f68;
  undefined4 uStack_f64;
  float *local_f58;
  undefined1 *local_f50;
  undefined1 *local_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  undefined4 uStack_f04;
  float *local_ef8;
  undefined1 *local_ef0;
  undefined1 *local_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  undefined4 uStack_ea4;
  float *local_e98;
  undefined1 *local_e90;
  undefined1 *local_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined4 local_e60;
  undefined4 uStack_e5c;
  undefined4 uStack_e58;
  undefined4 uStack_e54;
  undefined4 uStack_e50;
  undefined4 uStack_e4c;
  undefined4 uStack_e48;
  undefined4 uStack_e44;
  undefined1 *local_e38;
  float *local_e30;
  float *local_e28;
  float local_e20;
  float fStack_e1c;
  float fStack_e18;
  float fStack_e14;
  float fStack_e10;
  float fStack_e0c;
  float fStack_e08;
  float fStack_e04;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  float local_de0 [2];
  float afStack_dd8 [2];
  float afStack_dd0 [2];
  float afStack_dc8 [2];
  undefined1 local_dc0 [32];
  float local_da0 [2];
  float afStack_d98 [2];
  float afStack_d90 [2];
  float afStack_d88 [2];
  float local_d80;
  float fStack_d7c;
  float fStack_d78;
  float fStack_d74;
  float fStack_d70;
  float fStack_d6c;
  float fStack_d68;
  undefined4 uStack_d64;
  float local_d60 [2];
  float afStack_d58 [2];
  float afStack_d50 [2];
  float afStack_d48 [2];
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  undefined4 uStack_d24;
  float local_d20 [2];
  float afStack_d18 [2];
  float afStack_d10 [2];
  float afStack_d08 [2];
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  undefined4 uStack_ce4;
  float local_ce0 [2];
  float afStack_cd8 [2];
  float afStack_cd0 [2];
  float afStack_cc8 [2];
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  undefined4 uStack_ca4;
  float local_ca0 [2];
  float afStack_c98 [2];
  float afStack_c90 [2];
  float afStack_c88 [2];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  undefined4 uStack_c64;
  float local_c60 [2];
  float afStack_c58 [2];
  float afStack_c50 [2];
  float afStack_c48 [2];
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  undefined4 uStack_c24;
  float local_c20 [2];
  float afStack_c18 [2];
  float afStack_c10 [2];
  float afStack_c08 [2];
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  undefined4 uStack_be4;
  float local_be0 [2];
  float afStack_bd8 [2];
  float afStack_bd0 [2];
  float afStack_bc8 [2];
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  undefined4 uStack_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined4 local_9c4;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined4 local_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined4 local_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined1 local_750 [8];
  undefined8 uStack_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [8];
  undefined8 uStack_708;
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 *local_518;
  float *local_510;
  float *local_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  float local_4e0 [2];
  float afStack_4d8 [2];
  undefined1 local_4d0 [16];
  undefined1 *local_4b8;
  float *local_4b0;
  undefined1 *local_4a8;
  float local_4a0 [2];
  float afStack_498 [2];
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 *local_458;
  float *local_450;
  undefined1 *local_448;
  float local_440 [2];
  float afStack_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  float local_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  float *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  float local_3c0 [2];
  float afStack_3b8 [2];
  float local_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  float local_360 [2];
  float afStack_358 [2];
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  float local_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  float local_240 [2];
  float afStack_238 [2];
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  float local_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  ulong uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_16d0 = *(int *)((long)in_RDI + 0x2c);
  local_16d4 = (int)in_RDI[6];
  local_16d8 = *(int *)((long)in_RDI + 0x34);
  local_16dc = (int)in_RDI[7];
  local_16e0 = (int)in_RDI[3];
  local_16e4 = local_16d0 * local_16d4 * local_16d8 * local_16e0;
  local_16c0 = in_RDI;
  for (local_16e8 = 0; local_16e8 < local_16dc; local_16e8 = local_16e8 + 1) {
    local_16a8 = &local_1738;
    local_15fc = *(int *)((long)local_16c0 + 0x2c);
    local_1600 = (int)local_16c0[6];
    local_1604 = *(undefined4 *)((long)local_16c0 + 0x34);
    local_1610 = (undefined1 (*) [32])
                 (*local_16c0 + local_16c0[8] * (long)local_16e8 * local_16c0[2]);
    local_1618 = local_16c0[2];
    local_161c = (undefined4)local_16c0[3];
    local_1628 = local_16c0[4];
    local_15f8 = &local_1738;
    local_15e8 = (long)local_15fc * (long)local_1600 * local_1618;
    local_16a0 = &local_1738;
    local_1690 = &local_1738;
    local_15ec = 0x10;
    local_16b4 = local_16e8;
    local_16b5 = 1;
    local_1738 = 0;
    local_1728 = 0;
    local_1720 = 0;
    local_1710 = 0;
    local_170c = 0;
    local_1708 = 0;
    local_1704 = 0;
    local_1700 = 0;
    local_16f8 = 0;
    local_1730 = 0;
    local_16f0 = local_1610;
    for (local_173c = 0; local_173c + 7 < local_16e4; local_173c = local_173c + 8) {
      local_1688 = local_16f0;
      uStack_1210 = *(undefined8 *)(*local_16f0 + 0x10);
      uStack_1208 = *(undefined8 *)(*local_16f0 + 0x18);
      local_15a8 = local_16c9;
      local_15b0 = &local_1760;
      local_14c0 = 0x3f8000003f800000;
      uStack_14b8 = 0x3f8000003f800000;
      uStack_14b0 = 0x3f8000003f800000;
      uStack_14a8 = 0x3f8000003f800000;
      local_1320 = 0;
      uStack_1318 = 0;
      uStack_1310 = 0;
      uStack_1308 = 0;
      local_14e0 = vcmpps_avx(*local_16f0,ZEXT1632(ZEXT816(0)),2);
      local_1480 = SUB168(*(undefined1 (*) [16])*local_16f0,0);
      local_1220 = local_1480;
      uStack_1478 = SUB168(*(undefined1 (*) [16])*local_16f0,8);
      uStack_1218 = uStack_1478;
      local_1240 = 0x80000000800000;
      uStack_1238 = 0x80000000800000;
      uStack_1230 = 0x80000000800000;
      uStack_1228 = 0x80000000800000;
      auVar20._8_8_ = 0x80000000800000;
      auVar20._0_8_ = 0x80000000800000;
      auVar20._16_8_ = 0x80000000800000;
      auVar20._24_8_ = 0x80000000800000;
      auVar2 = vmaxps_avx(*local_16f0,auVar20);
      local_1480 = auVar2._0_8_;
      local_9a0 = local_1480;
      uStack_1478 = auVar2._8_8_;
      uStack_998 = uStack_1478;
      uStack_1470 = auVar2._16_8_;
      uStack_990 = uStack_1470;
      uStack_1468 = auVar2._24_8_;
      uStack_988 = uStack_1468;
      local_9c0 = local_1480;
      uStack_9b8 = uStack_1478;
      uStack_9b0 = uStack_1470;
      uStack_9a8 = uStack_1468;
      local_9c4 = 0x17;
      local_a40 = local_1480;
      uStack_a38 = uStack_1478;
      uStack_a30 = uStack_1470;
      uStack_a28 = uStack_1468;
      local_7a0 = local_1480;
      uStack_798 = uStack_1478;
      local_7a4 = 0x17;
      local_9e0 = vpsrld_avx(auVar2._0_16_,ZEXT416(0x17));
      local_7c0 = uStack_1470;
      uStack_7b8 = uStack_1468;
      local_7c4 = 0x17;
      local_9f0 = vpsrld_avx(auVar2._16_16_,ZEXT416(0x17));
      local_a60 = local_9e0._0_8_;
      uStack_a58 = local_9e0._8_8_;
      uStack_a50 = local_9f0._0_8_;
      uStack_a48 = local_9f0._8_8_;
      local_a20 = local_9e0._0_8_;
      uStack_a18 = local_9e0._8_8_;
      uStack_a10 = local_9f0._0_8_;
      uStack_a08 = local_9f0._8_8_;
      local_13c0 = local_1480;
      uStack_13b8 = uStack_1478;
      uStack_13b0 = uStack_1470;
      uStack_13a8 = uStack_1468;
      local_13e0 = 0x807fffff807fffff;
      uStack_13d8 = 0x807fffff807fffff;
      uStack_13d0 = 0x807fffff807fffff;
      uStack_13c8 = 0x807fffff807fffff;
      auVar18._8_8_ = 0x807fffff807fffff;
      auVar18._0_8_ = 0x807fffff807fffff;
      auVar18._16_8_ = 0x807fffff807fffff;
      auVar18._24_8_ = 0x807fffff807fffff;
      auVar2 = vandps_avx(auVar2,auVar18);
      local_1480 = auVar2._0_8_;
      local_920 = local_1480;
      uStack_1478 = auVar2._8_8_;
      uStack_918 = uStack_1478;
      uStack_1470 = auVar2._16_8_;
      uStack_910 = uStack_1470;
      uStack_1468 = auVar2._24_8_;
      uStack_908 = uStack_1468;
      local_940 = 0x3f0000003f000000;
      uStack_938 = 0x3f0000003f000000;
      uStack_930 = 0x3f0000003f000000;
      uStack_928 = 0x3f0000003f000000;
      auVar23._8_8_ = 0x3f0000003f000000;
      auVar23._0_8_ = 0x3f0000003f000000;
      auVar23._16_8_ = 0x3f0000003f000000;
      auVar23._24_8_ = 0x3f0000003f000000;
      auVar3 = vorps_avx(auVar2,auVar23);
      local_820 = local_9e0._0_8_;
      uStack_818 = local_9e0._8_8_;
      uStack_810 = local_9f0._0_8_;
      uStack_808 = local_9f0._8_8_;
      local_840 = 0x7f0000007f;
      uStack_838 = 0x7f0000007f;
      uStack_830 = 0x7f0000007f;
      uStack_828 = 0x7f0000007f;
      local_8c0 = local_9e0._0_8_;
      uStack_8b8 = local_9e0._8_8_;
      uStack_8b0 = local_9f0._0_8_;
      uStack_8a8 = local_9f0._8_8_;
      local_8e0 = 0x7f0000007f;
      uStack_8d8 = 0x7f0000007f;
      uStack_8d0 = 0x7f0000007f;
      uStack_8c8 = 0x7f0000007f;
      local_870 = 0x7f0000007f;
      uStack_868 = 0x7f0000007f;
      local_880 = 0x7f0000007f;
      uStack_878 = 0x7f0000007f;
      local_760 = local_9e0._0_8_;
      uStack_758 = local_9e0._8_8_;
      local_770 = 0x7f0000007f;
      uStack_768 = 0x7f0000007f;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      local_850 = vpsubd_avx(local_9e0,auVar4);
      local_780 = local_9f0._0_8_;
      uStack_778 = local_9f0._8_8_;
      local_790 = 0x7f0000007f;
      uStack_788 = 0x7f0000007f;
      auVar1._8_8_ = 0x7f0000007f;
      auVar1._0_8_ = 0x7f0000007f;
      local_860 = vpsubd_avx(local_9f0,auVar1);
      local_900 = local_850._0_8_;
      uStack_8f8 = local_850._8_8_;
      uStack_8f0 = local_860._0_8_;
      uStack_8e8 = local_860._8_8_;
      local_8a0 = local_850._0_8_;
      uStack_898 = local_850._8_8_;
      uStack_890 = local_860._0_8_;
      uStack_888 = local_860._8_8_;
      local_14a0 = local_850._0_8_;
      uStack_1498 = local_850._8_8_;
      uStack_1490 = local_860._0_8_;
      uStack_1488 = local_860._8_8_;
      local_800 = local_850._0_8_;
      uStack_7f8 = local_850._8_8_;
      uStack_7f0 = local_860._0_8_;
      uStack_7e8 = local_860._8_8_;
      auVar24._16_8_ = local_860._0_8_;
      auVar24._0_16_ = local_850;
      auVar24._24_8_ = local_860._8_8_;
      auVar2 = vcvtdq2ps_avx(auVar24);
      local_1500 = auVar2._0_8_;
      uVar6 = local_1500;
      uStack_14f8 = auVar2._8_8_;
      uVar7 = uStack_14f8;
      uStack_14f0 = auVar2._16_8_;
      uVar8 = uStack_14f0;
      uStack_14e8 = auVar2._24_8_;
      uVar9 = uStack_14e8;
      local_aa0 = 0x3f8000003f800000;
      uStack_a98 = 0x3f8000003f800000;
      uStack_a90 = 0x3f8000003f800000;
      uStack_a88 = 0x3f8000003f800000;
      local_a80._0_4_ = auVar2._0_4_;
      local_a80._4_4_ = auVar2._4_4_;
      uStack_a78._0_4_ = auVar2._8_4_;
      uStack_a78._4_4_ = auVar2._12_4_;
      uStack_a70._0_4_ = auVar2._16_4_;
      uStack_a70._4_4_ = auVar2._20_4_;
      uStack_a68._0_4_ = auVar2._24_4_;
      uStack_a68._4_4_ = auVar2._28_4_;
      local_1500._4_4_ = local_a80._4_4_ + 1.0;
      local_1500._0_4_ = (float)local_a80 + 1.0;
      uStack_14f8._0_4_ = (float)uStack_a78 + 1.0;
      uStack_14f8._4_4_ = uStack_a78._4_4_ + 1.0;
      uStack_14f0._0_4_ = (float)uStack_a70 + 1.0;
      uStack_14f0._4_4_ = uStack_a70._4_4_ + 1.0;
      auVar35 = _local_1500;
      uStack_14e8._0_4_ = (float)uStack_a68 + 1.0;
      uStack_14e8._4_4_ = uStack_a68._4_4_ + 1.0;
      auVar18 = _local_1500;
      local_1520 = vcmpps_avx(auVar3,_DAT_01f966a0,1);
      local_1480 = auVar3._0_8_;
      local_1400 = local_1480;
      uStack_1478 = auVar3._8_8_;
      uStack_13f8 = uStack_1478;
      uStack_1470 = auVar3._16_8_;
      uStack_13f0 = uStack_1470;
      uStack_1468 = auVar3._24_8_;
      uStack_13e8 = uStack_1468;
      local_1420 = local_1520._0_8_;
      uStack_1418 = local_1520._8_8_;
      uStack_1410 = local_1520._16_8_;
      uStack_1408 = local_1520._24_8_;
      local_1540 = vandps_avx(auVar3,local_1520);
      local_1340 = local_1480;
      uStack_1338 = uStack_1478;
      uStack_1330 = uStack_1470;
      uStack_1328 = uStack_1468;
      local_1360 = 0x3f8000003f800000;
      uStack_1358 = 0x3f8000003f800000;
      uStack_1350 = 0x3f8000003f800000;
      uStack_1348 = 0x3f8000003f800000;
      auVar2._8_8_ = 0x3f8000003f800000;
      auVar2._0_8_ = 0x3f8000003f800000;
      auVar2._16_8_ = 0x3f8000003f800000;
      auVar2._24_8_ = 0x3f8000003f800000;
      auVar2 = vsubps_avx(auVar3,auVar2);
      local_1380 = local_1500;
      uStack_1378 = uStack_14f8;
      uStack_14f0 = auVar35._16_8_;
      uStack_1370 = uStack_14f0;
      uStack_14e8 = auVar18._24_8_;
      uStack_1368 = uStack_14e8;
      local_1440 = 0x3f8000003f800000;
      uStack_1438 = 0x3f8000003f800000;
      uStack_1430 = 0x3f8000003f800000;
      uStack_1428 = 0x3f8000003f800000;
      local_1460 = local_1520._0_8_;
      uStack_1458 = local_1520._8_8_;
      uStack_1450 = local_1520._16_8_;
      uStack_1448 = local_1520._24_8_;
      auVar3._8_8_ = 0x3f8000003f800000;
      auVar3._0_8_ = 0x3f8000003f800000;
      auVar3._16_8_ = 0x3f8000003f800000;
      auVar3._24_8_ = 0x3f8000003f800000;
      local_13a0 = vandps_avx(auVar3,local_1520);
      auVar19._16_8_ = uStack_14f0;
      auVar19._0_16_ = _local_1500;
      auVar19._24_8_ = uStack_14e8;
      _local_1500 = vsubps_avx(auVar19,local_13a0);
      local_1480 = auVar2._0_8_;
      uVar10 = local_1480;
      uStack_1478 = auVar2._8_8_;
      uVar11 = uStack_1478;
      uStack_1470 = auVar2._16_8_;
      uVar12 = uStack_1470;
      uStack_1468 = auVar2._24_8_;
      uVar13 = uStack_1468;
      local_ac0._0_4_ = auVar2._0_4_;
      local_ac0._4_4_ = auVar2._4_4_;
      uStack_ab8._0_4_ = auVar2._8_4_;
      uStack_ab8._4_4_ = auVar2._12_4_;
      uStack_ab0._0_4_ = auVar2._16_4_;
      uStack_ab0._4_4_ = auVar2._20_4_;
      uStack_aa8._0_4_ = auVar2._24_4_;
      uStack_aa8._4_4_ = auVar2._28_4_;
      local_ae0._0_4_ = local_1540._0_4_;
      local_ae0._4_4_ = local_1540._4_4_;
      uStack_ad8._0_4_ = local_1540._8_4_;
      uStack_ad8._4_4_ = local_1540._12_4_;
      uStack_ad0._0_4_ = local_1540._16_4_;
      uStack_ad0._4_4_ = local_1540._20_4_;
      uStack_ac8._0_4_ = local_1540._24_4_;
      uStack_ac8._4_4_ = local_1540._28_4_;
      local_ac0._0_4_ = (float)local_ac0 + (float)local_ae0;
      local_ac0._4_4_ = local_ac0._4_4_ + local_ae0._4_4_;
      uStack_ab8._0_4_ = (float)uStack_ab8 + (float)uStack_ad8;
      uStack_ab8._4_4_ = uStack_ab8._4_4_ + uStack_ad8._4_4_;
      uStack_ab0._0_4_ = (float)uStack_ab0 + (float)uStack_ad0;
      uStack_ab0._4_4_ = uStack_ab0._4_4_ + uStack_ad0._4_4_;
      uStack_aa8._0_4_ = (float)uStack_aa8 + (float)uStack_ac8;
      fStack_1544 = uStack_aa8._4_4_ + uStack_ac8._4_4_;
      local_1480._4_4_ = local_ac0._4_4_;
      local_1480._0_4_ = (float)local_ac0;
      uStack_1478._0_4_ = (float)uStack_ab8;
      uStack_1478._4_4_ = uStack_ab8._4_4_;
      uStack_1470._0_4_ = (float)uStack_ab0;
      uStack_1470._4_4_ = uStack_ab0._4_4_;
      auVar35 = _local_1480;
      uStack_1468._0_4_ = (float)uStack_aa8;
      uStack_1468._4_4_ = fStack_1544;
      auVar2 = _local_1480;
      local_1280 = local_1480;
      uStack_1278 = uStack_1478;
      uStack_1470 = auVar35._16_8_;
      uStack_1270 = uStack_1470;
      uStack_1468 = auVar2._24_8_;
      uStack_1268 = uStack_1468;
      local_1560 = (float)local_ac0 * (float)local_ac0;
      fStack_155c = local_ac0._4_4_ * local_ac0._4_4_;
      fStack_1558 = (float)uStack_ab8 * (float)uStack_ab8;
      fStack_1554 = uStack_ab8._4_4_ * uStack_ab8._4_4_;
      fStack_1550 = (float)uStack_ab0 * (float)uStack_ab0;
      fStack_154c = uStack_ab0._4_4_ * uStack_ab0._4_4_;
      fStack_1548 = (float)uStack_aa8 * (float)uStack_aa8;
      local_e88 = local_1580;
      local_e90 = local_1480;
      local_e98 = ::_ps256_cephes_log_p1;
      local_e60 = 0x3d9021bb;
      uStack_e5c = 0x3d9021bb;
      uStack_e58 = 0x3d9021bb;
      uStack_e54 = 0x3d9021bb;
      uStack_e50 = 0x3d9021bb;
      uStack_e4c = 0x3d9021bb;
      uStack_e48 = 0x3d9021bb;
      uStack_e44 = 0x3d9021bb;
      local_e80 = local_1480;
      uStack_e78 = uStack_1478;
      uStack_e70 = uStack_1470;
      uStack_e68 = uStack_1468;
      local_d80 = (float)local_ac0 * 0.070376836;
      fStack_d7c = local_ac0._4_4_ * 0.070376836;
      fStack_d78 = (float)uStack_ab8 * 0.070376836;
      fStack_d74 = uStack_ab8._4_4_ * 0.070376836;
      fStack_d70 = (float)uStack_ab0 * 0.070376836;
      fStack_d6c = uStack_ab0._4_4_ * 0.070376836;
      fStack_d68 = (float)uStack_aa8 * 0.070376836;
      local_da0[0] = -0.1151461;
      local_da0[1] = -0.1151461;
      afStack_d98[0] = -0.1151461;
      afStack_d98[1] = -0.1151461;
      afStack_d90[0] = -0.1151461;
      afStack_d90[1] = -0.1151461;
      afStack_d88[0] = -0.1151461;
      afStack_d88[1] = -0.1151461;
      local_ec0 = local_d80 + -0.1151461;
      fStack_ebc = fStack_d7c + -0.1151461;
      fStack_eb8 = fStack_d78 + -0.1151461;
      fStack_eb4 = fStack_d74 + -0.1151461;
      fStack_eb0 = fStack_d70 + -0.1151461;
      fStack_eac = fStack_d6c + -0.1151461;
      fStack_ea8 = fStack_d68 + -0.1151461;
      uStack_ea4 = 0xbd375ffa;
      local_ee8 = local_1580;
      local_ef0 = local_1480;
      local_ef8 = ::_ps256_cephes_log_p2;
      local_ee0 = local_1480;
      uStack_ed8 = uStack_1478;
      uStack_ed0 = uStack_1470;
      uStack_ec8 = uStack_1468;
      local_d40 = local_ec0 * (float)local_ac0;
      fStack_d3c = fStack_ebc * local_ac0._4_4_;
      fStack_d38 = fStack_eb8 * (float)uStack_ab8;
      fStack_d34 = fStack_eb4 * uStack_ab8._4_4_;
      fStack_d30 = fStack_eb0 * (float)uStack_ab0;
      fStack_d2c = fStack_eac * uStack_ab0._4_4_;
      fStack_d28 = fStack_ea8 * (float)uStack_aa8;
      local_d60[0] = 0.116769984;
      local_d60[1] = 0.116769984;
      afStack_d58[0] = 0.116769984;
      afStack_d58[1] = 0.116769984;
      afStack_d50[0] = 0.116769984;
      afStack_d50[1] = 0.116769984;
      afStack_d48[0] = 0.116769984;
      afStack_d48[1] = 0.116769984;
      local_f20 = local_d40 + 0.116769984;
      fStack_f1c = fStack_d3c + 0.116769984;
      fStack_f18 = fStack_d38 + 0.116769984;
      fStack_f14 = fStack_d34 + 0.116769984;
      fStack_f10 = fStack_d30 + 0.116769984;
      fStack_f0c = fStack_d2c + 0.116769984;
      fStack_f08 = fStack_d28 + 0.116769984;
      uStack_f04 = 0x3d93751d;
      local_f48 = local_1580;
      local_f50 = local_1480;
      local_f58 = ::_ps256_cephes_log_p3;
      local_f40 = local_1480;
      uStack_f38 = uStack_1478;
      uStack_f30 = uStack_1470;
      uStack_f28 = uStack_1468;
      local_d00 = local_f20 * (float)local_ac0;
      fStack_cfc = fStack_f1c * local_ac0._4_4_;
      fStack_cf8 = fStack_f18 * (float)uStack_ab8;
      fStack_cf4 = fStack_f14 * uStack_ab8._4_4_;
      fStack_cf0 = fStack_f10 * (float)uStack_ab0;
      fStack_cec = fStack_f0c * uStack_ab0._4_4_;
      fStack_ce8 = fStack_f08 * (float)uStack_aa8;
      local_d20[0] = -0.12420141;
      local_d20[1] = -0.12420141;
      afStack_d18[0] = -0.12420141;
      afStack_d18[1] = -0.12420141;
      afStack_d10[0] = -0.12420141;
      afStack_d10[1] = -0.12420141;
      afStack_d08[0] = -0.12420141;
      afStack_d08[1] = -0.12420141;
      local_f80 = local_d00 + -0.12420141;
      fStack_f7c = fStack_cfc + -0.12420141;
      fStack_f78 = fStack_cf8 + -0.12420141;
      fStack_f74 = fStack_cf4 + -0.12420141;
      fStack_f70 = fStack_cf0 + -0.12420141;
      fStack_f6c = fStack_cec + -0.12420141;
      fStack_f68 = fStack_ce8 + -0.12420141;
      uStack_f64 = 0xbd55d064;
      local_fa8 = local_1580;
      local_fb0 = local_1480;
      local_fb8 = ::_ps256_cephes_log_p4;
      local_fa0 = local_1480;
      uStack_f98 = uStack_1478;
      uStack_f90 = uStack_1470;
      uStack_f88 = uStack_1468;
      local_cc0 = local_f80 * (float)local_ac0;
      fStack_cbc = fStack_f7c * local_ac0._4_4_;
      fStack_cb8 = fStack_f78 * (float)uStack_ab8;
      fStack_cb4 = fStack_f74 * uStack_ab8._4_4_;
      fStack_cb0 = fStack_f70 * (float)uStack_ab0;
      fStack_cac = fStack_f6c * uStack_ab0._4_4_;
      fStack_ca8 = fStack_f68 * (float)uStack_aa8;
      local_ce0[0] = 0.14249323;
      local_ce0[1] = 0.14249323;
      afStack_cd8[0] = 0.14249323;
      afStack_cd8[1] = 0.14249323;
      afStack_cd0[0] = 0.14249323;
      afStack_cd0[1] = 0.14249323;
      afStack_cc8[0] = 0.14249323;
      afStack_cc8[1] = 0.14249323;
      local_fe0 = local_cc0 + 0.14249323;
      fStack_fdc = fStack_cbc + 0.14249323;
      fStack_fd8 = fStack_cb8 + 0.14249323;
      fStack_fd4 = fStack_cb4 + 0.14249323;
      fStack_fd0 = fStack_cb0 + 0.14249323;
      fStack_fcc = fStack_cac + 0.14249323;
      fStack_fc8 = fStack_ca8 + 0.14249323;
      uStack_fc4 = 0x3db8eb4c;
      local_1008 = local_1580;
      local_1010 = local_1480;
      local_1018 = ::_ps256_cephes_log_p5;
      local_1000 = local_1480;
      uStack_ff8 = uStack_1478;
      uStack_ff0 = uStack_1470;
      uStack_fe8 = uStack_1468;
      local_c80 = local_fe0 * (float)local_ac0;
      fStack_c7c = fStack_fdc * local_ac0._4_4_;
      fStack_c78 = fStack_fd8 * (float)uStack_ab8;
      fStack_c74 = fStack_fd4 * uStack_ab8._4_4_;
      fStack_c70 = fStack_fd0 * (float)uStack_ab0;
      fStack_c6c = fStack_fcc * uStack_ab0._4_4_;
      fStack_c68 = fStack_fc8 * (float)uStack_aa8;
      local_ca0[0] = -0.16668057;
      local_ca0[1] = -0.16668057;
      afStack_c98[0] = -0.16668057;
      afStack_c98[1] = -0.16668057;
      afStack_c90[0] = -0.16668057;
      afStack_c90[1] = -0.16668057;
      afStack_c88[0] = -0.16668057;
      afStack_c88[1] = -0.16668057;
      local_1040 = local_c80 + -0.16668057;
      fStack_103c = fStack_c7c + -0.16668057;
      fStack_1038 = fStack_c78 + -0.16668057;
      fStack_1034 = fStack_c74 + -0.16668057;
      fStack_1030 = fStack_c70 + -0.16668057;
      fStack_102c = fStack_c6c + -0.16668057;
      fStack_1028 = fStack_c68 + -0.16668057;
      uStack_1024 = 0xbd9c7154;
      local_1068 = local_1580;
      local_1070 = local_1480;
      local_1078 = ::_ps256_cephes_log_p6;
      local_1060 = local_1480;
      uStack_1058 = uStack_1478;
      uStack_1050 = uStack_1470;
      uStack_1048 = uStack_1468;
      local_c40 = local_1040 * (float)local_ac0;
      fStack_c3c = fStack_103c * local_ac0._4_4_;
      fStack_c38 = fStack_1038 * (float)uStack_ab8;
      fStack_c34 = fStack_1034 * uStack_ab8._4_4_;
      fStack_c30 = fStack_1030 * (float)uStack_ab0;
      fStack_c2c = fStack_102c * uStack_ab0._4_4_;
      fStack_c28 = fStack_1028 * (float)uStack_aa8;
      local_c60[0] = 0.20000714;
      local_c60[1] = 0.20000714;
      afStack_c58[0] = 0.20000714;
      afStack_c58[1] = 0.20000714;
      afStack_c50[0] = 0.20000714;
      afStack_c50[1] = 0.20000714;
      afStack_c48[0] = 0.20000714;
      afStack_c48[1] = 0.20000714;
      local_10a0 = local_c40 + 0.20000714;
      fStack_109c = fStack_c3c + 0.20000714;
      fStack_1098 = fStack_c38 + 0.20000714;
      fStack_1094 = fStack_c34 + 0.20000714;
      fStack_1090 = fStack_c30 + 0.20000714;
      fStack_108c = fStack_c2c + 0.20000714;
      fStack_1088 = fStack_c28 + 0.20000714;
      uStack_1084 = 0x3dfd2c04;
      local_10c8 = local_1580;
      local_10d0 = local_1480;
      local_10d8 = ::_ps256_cephes_log_p7;
      local_10c0 = local_1480;
      uStack_10b8 = uStack_1478;
      uStack_10b0 = uStack_1470;
      uStack_10a8 = uStack_1468;
      local_c00 = local_10a0 * (float)local_ac0;
      fStack_bfc = fStack_109c * local_ac0._4_4_;
      fStack_bf8 = fStack_1098 * (float)uStack_ab8;
      fStack_bf4 = fStack_1094 * uStack_ab8._4_4_;
      fStack_bf0 = fStack_1090 * (float)uStack_ab0;
      fStack_bec = fStack_108c * uStack_ab0._4_4_;
      fStack_be8 = fStack_1088 * (float)uStack_aa8;
      local_c20[0] = -0.24999994;
      local_c20[1] = -0.24999994;
      afStack_c18[0] = -0.24999994;
      afStack_c18[1] = -0.24999994;
      afStack_c10[0] = -0.24999994;
      afStack_c10[1] = -0.24999994;
      afStack_c08[0] = -0.24999994;
      afStack_c08[1] = -0.24999994;
      local_1100 = local_c00 + -0.24999994;
      fStack_10fc = fStack_bfc + -0.24999994;
      fStack_10f8 = fStack_bf8 + -0.24999994;
      fStack_10f4 = fStack_bf4 + -0.24999994;
      fStack_10f0 = fStack_bf0 + -0.24999994;
      fStack_10ec = fStack_bec + -0.24999994;
      fStack_10e8 = fStack_be8 + -0.24999994;
      uStack_10e4 = 0xbe0169fa;
      local_1128 = local_1580;
      local_1130 = local_1480;
      local_1138 = ::_ps256_cephes_log_p8;
      local_1120 = local_1480;
      uStack_1118 = uStack_1478;
      uStack_1110 = uStack_1470;
      uStack_1108 = uStack_1468;
      local_bc0 = local_1100 * (float)local_ac0;
      fStack_bbc = fStack_10fc * local_ac0._4_4_;
      fStack_bb8 = fStack_10f8 * (float)uStack_ab8;
      fStack_bb4 = fStack_10f4 * uStack_ab8._4_4_;
      fStack_bb0 = fStack_10f0 * (float)uStack_ab0;
      fStack_bac = fStack_10ec * uStack_ab0._4_4_;
      fStack_ba8 = fStack_10e8 * (float)uStack_aa8;
      local_be0[0] = 0.3333333;
      local_be0[1] = 0.3333333;
      afStack_bd8[0] = 0.3333333;
      afStack_bd8[1] = 0.3333333;
      afStack_bd0[0] = 0.3333333;
      afStack_bd0[1] = 0.3333333;
      afStack_bc8[0] = 0.3333333;
      afStack_bc8[1] = 0.3333333;
      local_1580._4_4_ = fStack_bbc + 0.3333333;
      local_1580._0_4_ = local_bc0 + 0.3333333;
      uStack_1578._0_4_ = fStack_bb8 + 0.3333333;
      uStack_1578._4_4_ = fStack_bb4 + 0.3333333;
      uStack_1570._0_4_ = fStack_bb0 + 0.3333333;
      uStack_1570._4_4_ = fStack_bac + 0.3333333;
      auVar35 = _local_1580;
      uStack_1568._0_4_ = fStack_ba8 + 0.3333333;
      uStack_1568._4_4_ = 0x3e53eb5a;
      auVar2 = _local_1580;
      local_12a0 = local_1580;
      uStack_1298 = uStack_1578;
      uStack_1570 = auVar35._16_8_;
      uStack_1290 = uStack_1570;
      uStack_1568 = auVar2._24_8_;
      uStack_1288 = uStack_1568;
      local_12c0 = local_1480;
      uStack_12b8 = uStack_1478;
      uStack_12b0 = uStack_1470;
      uStack_12a8 = uStack_1468;
      local_1580._0_4_ = (local_bc0 + 0.3333333) * (float)local_ac0;
      local_1580._4_4_ = (fStack_bbc + 0.3333333) * local_ac0._4_4_;
      fVar36 = (fStack_bb8 + 0.3333333) * (float)uStack_ab8;
      fVar37 = (fStack_bb4 + 0.3333333) * uStack_ab8._4_4_;
      fVar38 = (fStack_bb0 + 0.3333333) * (float)uStack_ab0;
      fVar39 = (fStack_bac + 0.3333333) * uStack_ab0._4_4_;
      fVar40 = (fStack_ba8 + 0.3333333) * (float)uStack_aa8;
      uStack_1578._0_4_ = fVar36;
      uStack_1578._4_4_ = fVar37;
      uStack_1570._0_4_ = fVar38;
      uStack_1570._4_4_ = fVar39;
      auVar35 = _local_1580;
      uStack_1568._0_4_ = fVar40;
      uStack_1568._4_4_ = 0x3e53eb5a;
      auVar2 = _local_1580;
      local_12e0 = local_1580;
      uStack_12d8 = uStack_1578;
      uStack_1570 = auVar35._16_8_;
      uStack_12d0 = uStack_1570;
      uStack_1568 = auVar2._24_8_;
      uStack_12c8 = uStack_1568;
      local_1300 = CONCAT44(fStack_155c,local_1560);
      uStack_12f8 = CONCAT44(fStack_1554,fStack_1558);
      uStack_12f0 = CONCAT44(fStack_154c,fStack_1550);
      uStack_12e8 = CONCAT44(fStack_1544,fStack_1548);
      local_1580._0_4_ = (float)local_1580._0_4_ * local_1560;
      local_1580._4_4_ = (float)local_1580._4_4_ * fStack_155c;
      fVar36 = fVar36 * fStack_1558;
      fVar37 = fVar37 * fStack_1554;
      fVar38 = fVar38 * fStack_1550;
      fVar39 = fVar39 * fStack_154c;
      fVar40 = fVar40 * fStack_1548;
      uStack_1578._0_4_ = fVar36;
      uStack_1578._4_4_ = fVar37;
      uStack_1570._0_4_ = fVar38;
      uStack_1570._4_4_ = fVar39;
      auVar35 = _local_1580;
      uStack_1568._0_4_ = fVar40;
      uStack_1568._4_4_ = 0x3e53eb5a;
      auVar2 = _local_1580;
      local_1188 = local_1500;
      local_1190 = ::_ps256_cephes_log_q1;
      local_1198 = local_1580;
      local_1160 = (float)local_1500._0_4_;
      fStack_115c = (float)local_1500._4_4_;
      fStack_1158 = (float)uStack_14f8;
      fStack_1154 = uStack_14f8._4_4_;
      fStack_1150 = (float)uStack_14f0;
      fStack_114c = uStack_14f0._4_4_;
      fStack_1148 = (float)uStack_14e8;
      fStack_1144 = uStack_14e8._4_4_;
      local_1180[0] = -0.00021219444;
      local_1180[1] = -0.00021219444;
      afStack_1178[0] = -0.00021219444;
      afStack_1178[1] = -0.00021219444;
      afStack_1170[0] = -0.00021219444;
      afStack_1170[1] = -0.00021219444;
      afStack_1168[0] = -0.00021219444;
      afStack_1168[1] = -0.00021219444;
      local_b80 = (float)local_1500._0_4_ * -0.00021219444;
      fStack_b7c = (float)local_1500._4_4_ * -0.00021219444;
      fStack_b78 = (float)uStack_14f8 * -0.00021219444;
      fStack_b74 = uStack_14f8._4_4_ * -0.00021219444;
      fStack_b70 = (float)uStack_14f0 * -0.00021219444;
      fStack_b6c = uStack_14f0._4_4_ * -0.00021219444;
      fStack_b68 = (float)uStack_14e8 * -0.00021219444;
      local_ba0 = local_1580;
      uStack_b98 = uStack_1578;
      uStack_1570 = auVar35._16_8_;
      uStack_b90 = uStack_1570;
      uStack_1568 = auVar2._24_8_;
      uStack_b88 = uStack_1568;
      local_1580._4_4_ = fStack_b7c + (float)local_1580._4_4_;
      local_1580._0_4_ = local_b80 + (float)local_1580._0_4_;
      uStack_1578._0_4_ = fStack_b78 + fVar36;
      uStack_1578._4_4_ = fStack_b74 + fVar37;
      uStack_1570._0_4_ = fStack_b70 + fVar38;
      uStack_1570._4_4_ = fStack_b6c + fVar39;
      auVar35 = _local_1580;
      uStack_1568._0_4_ = fStack_b68 + fVar40;
      uStack_1568._4_4_ = uStack_14e8._4_4_ + 0.20695248;
      auVar2 = _local_1580;
      local_e28 = &local_1560;
      local_e30 = ::_ps256_0p5;
      local_e38 = local_1580;
      local_e00 = local_1580;
      uStack_df8 = uStack_1578;
      uStack_1570 = auVar35._16_8_;
      uStack_df0 = uStack_1570;
      uStack_1568 = auVar2._24_8_;
      uStack_de8 = uStack_1568;
      local_dc0._4_4_ = fStack_155c;
      local_dc0._0_4_ = local_1560;
      local_dc0._8_4_ = fStack_1558;
      local_dc0._12_4_ = fStack_1554;
      local_dc0._16_4_ = fStack_1550;
      local_dc0._20_4_ = fStack_154c;
      local_dc0._24_4_ = fStack_1548;
      local_dc0._28_4_ = fStack_1544;
      local_de0[0] = 0.5;
      local_de0[1] = 0.5;
      afStack_dd8[0] = 0.5;
      afStack_dd8[1] = 0.5;
      afStack_dd0[0] = 0.5;
      afStack_dd0[1] = 0.5;
      afStack_dc8[0] = 0.5;
      afStack_dc8[1] = 0.5;
      local_e20 = local_1560 * 0.5;
      fStack_e1c = fStack_155c * 0.5;
      fStack_e18 = fStack_1558 * 0.5;
      fStack_e14 = fStack_1554 * 0.5;
      fStack_e10 = fStack_1550 * 0.5;
      fStack_e0c = fStack_154c * 0.5;
      fStack_e08 = fStack_1548 * 0.5;
      auVar21._4_4_ = fStack_e1c;
      auVar21._0_4_ = local_e20;
      auVar21._8_4_ = fStack_e18;
      auVar21._12_4_ = fStack_e14;
      auVar21._16_4_ = fStack_e10;
      auVar21._20_4_ = fStack_e0c;
      auVar21._24_4_ = fStack_e08;
      auVar21._28_4_ = fStack_1544;
      auVar2 = vsubps_avx(auVar2,auVar21);
      local_b00 = local_1480;
      uStack_af8 = uStack_1478;
      uStack_af0 = uStack_1470;
      uStack_ae8 = uStack_1468;
      local_1580 = auVar2._0_8_;
      uVar14 = local_1580;
      uStack_1578 = auVar2._8_8_;
      uVar15 = uStack_1578;
      uStack_1570 = auVar2._16_8_;
      uVar16 = uStack_1570;
      uStack_1568 = auVar2._24_8_;
      uVar17 = uStack_1568;
      local_b20._0_4_ = auVar2._0_4_;
      local_b20._4_4_ = auVar2._4_4_;
      uStack_b18._0_4_ = auVar2._8_4_;
      uStack_b18._4_4_ = auVar2._12_4_;
      uStack_b10._0_4_ = auVar2._16_4_;
      uStack_b10._4_4_ = auVar2._20_4_;
      uStack_b08._0_4_ = auVar2._24_4_;
      uStack_b08._4_4_ = auVar2._28_4_;
      local_1480._4_4_ = local_ac0._4_4_ + local_b20._4_4_;
      local_1480._0_4_ = (float)local_ac0 + (float)local_b20;
      uStack_1478._0_4_ = (float)uStack_ab8 + (float)uStack_b18;
      uStack_1478._4_4_ = uStack_ab8._4_4_ + uStack_b18._4_4_;
      uStack_1470._0_4_ = (float)uStack_ab0 + (float)uStack_b10;
      uStack_1470._4_4_ = uStack_ab0._4_4_ + uStack_b10._4_4_;
      auVar35 = _local_1480;
      uStack_1468._0_4_ = (float)uStack_aa8 + (float)uStack_b08;
      uStack_1468._4_4_ = fStack_1544 + uStack_b08._4_4_;
      auVar2 = _local_1480;
      local_11e8 = local_1500;
      local_11f0 = ::_ps256_cephes_log_q2;
      local_11f8 = local_1480;
      local_11c0 = (float)local_1500._0_4_;
      fStack_11bc = (float)local_1500._4_4_;
      fStack_11b8 = (float)uStack_14f8;
      fStack_11b4 = uStack_14f8._4_4_;
      fStack_11b0 = (float)uStack_14f0;
      fStack_11ac = uStack_14f0._4_4_;
      fStack_11a8 = (float)uStack_14e8;
      fStack_11a4 = uStack_14e8._4_4_;
      local_11e0[0] = 0.6933594;
      local_11e0[1] = 0.6933594;
      afStack_11d8[0] = 0.6933594;
      afStack_11d8[1] = 0.6933594;
      afStack_11d0[0] = 0.6933594;
      afStack_11d0[1] = 0.6933594;
      afStack_11c8[0] = 0.6933594;
      afStack_11c8[1] = 0.6933594;
      local_b40 = (float)local_1500._0_4_ * 0.6933594;
      fStack_b3c = (float)local_1500._4_4_ * 0.6933594;
      fStack_b38 = (float)uStack_14f8 * 0.6933594;
      fStack_b34 = uStack_14f8._4_4_ * 0.6933594;
      fStack_b30 = (float)uStack_14f0 * 0.6933594;
      fStack_b2c = uStack_14f0._4_4_ * 0.6933594;
      fStack_b28 = (float)uStack_14e8 * 0.6933594;
      local_b60 = local_1480;
      uStack_b58 = uStack_1478;
      uStack_1470 = auVar35._16_8_;
      uStack_b50 = uStack_1470;
      uStack_1468 = auVar2._24_8_;
      uStack_b48 = uStack_1468;
      local_1480._4_4_ = fStack_b3c + local_ac0._4_4_ + local_b20._4_4_;
      local_1480._0_4_ = local_b40 + (float)local_ac0 + (float)local_b20;
      uStack_1478._0_4_ = fStack_b38 + (float)uStack_ab8 + (float)uStack_b18;
      uStack_1478._4_4_ = fStack_b34 + uStack_ab8._4_4_ + uStack_b18._4_4_;
      uStack_1470._0_4_ = fStack_b30 + (float)uStack_ab0 + (float)uStack_b10;
      uStack_1470._4_4_ = fStack_b2c + uStack_ab0._4_4_ + uStack_b10._4_4_;
      auVar35 = _local_1480;
      uStack_1468._0_4_ = fStack_b28 + (float)uStack_aa8 + (float)uStack_b08;
      uStack_1468._4_4_ = uStack_14e8._4_4_ + fStack_1544 + uStack_b08._4_4_;
      auVar2 = _local_1480;
      local_960 = local_1480;
      uStack_958 = uStack_1478;
      uStack_1470 = auVar35._16_8_;
      uStack_950 = uStack_1470;
      uStack_1468 = auVar2._24_8_;
      uStack_948 = uStack_1468;
      local_980 = local_14e0._0_8_;
      uStack_978 = local_14e0._8_8_;
      uStack_970 = local_14e0._16_8_;
      uStack_968 = local_14e0._24_8_;
      auVar22._16_8_ = uStack_1470;
      auVar22._0_16_ = _local_1480;
      auVar22._24_8_ = uStack_1468;
      _local_1580 = vorps_avx(auVar22,local_14e0);
      local_1760 = local_1580;
      uStack_1758 = uStack_1578;
      uStack_1750 = uStack_1570;
      uStack_1748 = uStack_1568;
      local_1650 = local_16f0;
      local_1680 = local_1580;
      uStack_1678 = uStack_1578;
      uStack_1670 = uStack_1570;
      uStack_1668 = uStack_1568;
      *local_16f0 = _local_1580;
      local_16f0 = local_16f0 + 1;
      _local_1480 = auVar2;
      local_1260 = local_1280;
      uStack_1258 = uStack_1278;
      uStack_1250 = uStack_1270;
      uStack_1248 = uStack_1268;
      fStack_e04 = fStack_1544;
      uStack_d64 = uStack_e44;
      uStack_d24 = uStack_ea4;
      uStack_ce4 = uStack_f04;
      uStack_ca4 = uStack_f64;
      uStack_c64 = uStack_fc4;
      uStack_c24 = uStack_1024;
      uStack_be4 = uStack_1084;
      uStack_ba4 = uStack_10e4;
      fStack_b64 = fStack_1144;
      fStack_b24 = fStack_11a4;
      local_b20 = uVar14;
      uStack_b18 = uVar15;
      uStack_b10 = uVar16;
      uStack_b08 = uVar17;
      local_ae0 = local_1540._0_8_;
      uStack_ad8 = local_1540._8_8_;
      uStack_ad0 = local_1540._16_8_;
      uStack_ac8 = local_1540._24_8_;
      local_ac0 = uVar10;
      uStack_ab8 = uVar11;
      uStack_ab0 = uVar12;
      uStack_aa8 = uVar13;
      local_a80 = uVar6;
      uStack_a78 = uVar7;
      uStack_a70 = uVar8;
      uStack_a68 = uVar9;
    }
    for (; local_15d8 = local_1690, local_1718 = local_1628, local_173c + 3 < local_16e4;
        local_173c = local_173c + 4) {
      local_1648 = local_16f0;
      local_5a0 = *(undefined8 *)*local_16f0;
      uStack_598 = *(undefined8 *)(*local_16f0 + 8);
      local_1598 = local_16c9;
      local_15a0 = &local_1770;
      local_6f0 = 0x3f8000003f800000;
      uStack_6e8 = 0x3f8000003f800000;
      local_c0 = 0;
      local_620._8_8_ = SUB168(ZEXT816(0),4);
      uStack_b8 = local_620._8_8_;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_620._8_8_;
      local_700 = vcmpps_avx(*(undefined1 (*) [16])*local_16f0,auVar34 << 0x40,2);
      local_5b0 = 0x80000000800000;
      uStack_5a8 = 0x80000000800000;
      auVar28._8_8_ = 0x80000000800000;
      auVar28._0_8_ = 0x80000000800000;
      auVar1 = vmaxps_avx(*(undefined1 (*) [16])*local_16f0,auVar28);
      local_6d0 = auVar1._0_8_;
      local_a0 = local_6d0;
      uStack_6c8 = auVar1._8_8_;
      uStack_98 = uStack_6c8;
      local_f0 = local_6d0;
      uStack_e8 = uStack_6c8;
      local_f4 = 0x17;
      auVar5 = vpsrld_avx(auVar1,ZEXT416(0x17));
      local_670 = local_6d0;
      uStack_668 = uStack_6c8;
      local_680 = 0x807fffff807fffff;
      uStack_678 = 0x807fffff807fffff;
      auVar25._8_8_ = 0x807fffff807fffff;
      auVar25._0_8_ = 0x807fffff807fffff;
      auVar1 = vpand_avx(auVar1,auVar25);
      local_6d0 = auVar1._0_8_;
      local_60 = local_6d0;
      uStack_6c8 = auVar1._8_8_;
      uStack_58 = uStack_6c8;
      local_70 = 0x3f0000003f000000;
      uStack_68 = 0x3f0000003f000000;
      auVar32._8_8_ = 0x3f0000003f000000;
      auVar32._0_8_ = 0x3f0000003f000000;
      auVar4 = vpor_avx(auVar1,auVar32);
      local_6e0._0_8_ = auVar5._0_8_;
      local_d0 = local_6e0._0_8_;
      local_6e0._8_8_ = auVar5._8_8_;
      uStack_c8 = local_6e0._8_8_;
      local_e0 = 0x7f0000007f;
      uStack_d8 = 0x7f0000007f;
      auVar30._8_8_ = 0x7f0000007f;
      auVar30._0_8_ = 0x7f0000007f;
      local_6e0 = vpsubd_avx(auVar5,auVar30);
      local_530 = local_6e0._0_8_;
      uStack_528 = local_6e0._8_8_;
      auVar1 = vcvtdq2ps_avx(local_6e0);
      local_710 = auVar1._0_8_;
      uVar6 = local_710;
      uStack_708 = auVar1._8_8_;
      uVar7 = uStack_708;
      local_550 = 0x3f8000003f800000;
      uStack_548 = 0x3f8000003f800000;
      local_540._0_4_ = auVar1._0_4_;
      local_540._4_4_ = auVar1._4_4_;
      uStack_538._0_4_ = auVar1._8_4_;
      uStack_538._4_4_ = auVar1._12_4_;
      local_710._4_4_ = local_540._4_4_ + 1.0;
      local_710._0_4_ = (float)local_540 + 1.0;
      uStack_708._0_4_ = (float)uStack_538 + 1.0;
      uStack_708._4_4_ = uStack_538._4_4_ + 1.0;
      local_6d0 = auVar4._0_8_;
      local_40 = local_6d0;
      uStack_6c8 = auVar4._8_8_;
      uStack_38 = uStack_6c8;
      local_50 = 0x3f3504f33f3504f3;
      uStack_48 = 0x3f3504f33f3504f3;
      auVar33._8_8_ = 0x3f3504f33f3504f3;
      auVar33._0_8_ = 0x3f3504f33f3504f3;
      local_720 = vcmpps_avx(auVar4,auVar33,1);
      local_690 = local_6d0;
      uStack_688 = uStack_6c8;
      local_6a0 = local_720._0_8_;
      uStack_698 = local_720._8_8_;
      local_730 = vpand_avx(auVar4,local_720);
      local_630 = local_6d0;
      uStack_628 = uStack_6c8;
      local_640 = 0x3f8000003f800000;
      uStack_638 = 0x3f8000003f800000;
      auVar27._8_8_ = 0x3f8000003f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(auVar4,auVar27);
      local_650 = local_710;
      uStack_648 = uStack_708;
      local_6b0 = 0x3f8000003f800000;
      uStack_6a8 = 0x3f8000003f800000;
      local_6c0 = local_720._0_8_;
      uStack_6b8 = local_720._8_8_;
      auVar5._8_8_ = 0x3f8000003f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      local_660 = vpand_avx(auVar5,local_720);
      auVar26._8_8_ = uStack_708;
      auVar26._0_8_ = local_710;
      _local_710 = vsubps_avx(auVar26,local_660);
      local_6d0 = auVar1._0_8_;
      uVar8 = local_6d0;
      uStack_6c8 = auVar1._8_8_;
      uVar9 = uStack_6c8;
      local_560._0_4_ = auVar1._0_4_;
      local_560._4_4_ = auVar1._4_4_;
      uStack_558._0_4_ = auVar1._8_4_;
      uStack_558._4_4_ = auVar1._12_4_;
      local_570._0_4_ = local_730._0_4_;
      local_570._4_4_ = local_730._4_4_;
      uStack_568._0_4_ = local_730._8_4_;
      uStack_568._4_4_ = local_730._12_4_;
      local_560._0_4_ = (float)local_560 + (float)local_570;
      local_560._4_4_ = local_560._4_4_ + local_570._4_4_;
      uStack_558._0_4_ = (float)uStack_558 + (float)uStack_568;
      uStack_558._4_4_ = uStack_558._4_4_ + uStack_568._4_4_;
      local_6d0._4_4_ = local_560._4_4_;
      local_6d0._0_4_ = (float)local_560;
      uStack_6c8._0_4_ = (float)uStack_558;
      uStack_6c8._4_4_ = uStack_558._4_4_;
      local_5d0 = local_6d0;
      uStack_5c8 = uStack_6c8;
      local_740 = (float)local_560 * (float)local_560;
      fStack_73c = local_560._4_4_ * local_560._4_4_;
      fStack_738 = (float)uStack_558 * (float)uStack_558;
      fStack_734 = uStack_558._4_4_ * uStack_558._4_4_;
      local_148 = local_750;
      local_150 = local_6d0;
      local_158 = ::_ps_cephes_log_p1;
      local_130 = 0x3d9021bb3d9021bb;
      uStack_128 = 0x3d9021bb3d9021bb;
      local_140 = local_6d0;
      uStack_138 = uStack_6c8;
      local_110 = (float)local_560 * 0.070376836;
      fStack_10c = local_560._4_4_ * 0.070376836;
      fStack_108 = (float)uStack_558 * 0.070376836;
      fStack_104 = uStack_558._4_4_ * 0.070376836;
      local_120[0] = -0.1151461;
      local_120[1] = -0.1151461;
      afStack_118[0] = -0.1151461;
      afStack_118[1] = -0.1151461;
      local_750._4_4_ = fStack_10c + -0.1151461;
      local_750._0_4_ = local_110 + -0.1151461;
      uStack_748._0_4_ = fStack_108 + -0.1151461;
      uStack_748._4_4_ = fStack_104 + -0.1151461;
      local_1a8 = local_750;
      local_1b0 = local_6d0;
      local_1b8 = ::_ps_cephes_log_p2;
      local_190 = local_750;
      uStack_188 = uStack_748;
      local_1a0 = local_6d0;
      uStack_198 = uStack_6c8;
      local_170 = (local_110 + -0.1151461) * (float)local_560;
      fStack_16c = (fStack_10c + -0.1151461) * local_560._4_4_;
      fStack_168 = (fStack_108 + -0.1151461) * (float)uStack_558;
      fStack_164 = (fStack_104 + -0.1151461) * uStack_558._4_4_;
      local_180[0] = 0.116769984;
      local_180[1] = 0.116769984;
      afStack_178[0] = 0.116769984;
      afStack_178[1] = 0.116769984;
      local_750._4_4_ = fStack_16c + 0.116769984;
      local_750._0_4_ = local_170 + 0.116769984;
      uStack_748._0_4_ = fStack_168 + 0.116769984;
      uStack_748._4_4_ = fStack_164 + 0.116769984;
      local_208 = local_750;
      local_210 = local_6d0;
      local_218 = ::_ps_cephes_log_p3;
      local_1f0 = local_750;
      uStack_1e8 = uStack_748;
      local_200 = local_6d0;
      uStack_1f8 = uStack_6c8;
      local_1d0 = (local_170 + 0.116769984) * (float)local_560;
      fStack_1cc = (fStack_16c + 0.116769984) * local_560._4_4_;
      fStack_1c8 = (fStack_168 + 0.116769984) * (float)uStack_558;
      fStack_1c4 = (fStack_164 + 0.116769984) * uStack_558._4_4_;
      local_1e0[0] = -0.12420141;
      local_1e0[1] = -0.12420141;
      afStack_1d8[0] = -0.12420141;
      afStack_1d8[1] = -0.12420141;
      local_750._4_4_ = fStack_1cc + -0.12420141;
      local_750._0_4_ = local_1d0 + -0.12420141;
      uStack_748._0_4_ = fStack_1c8 + -0.12420141;
      uStack_748._4_4_ = fStack_1c4 + -0.12420141;
      local_268 = local_750;
      local_270 = local_6d0;
      local_278 = ::_ps_cephes_log_p4;
      local_250 = local_750;
      uStack_248 = uStack_748;
      local_260 = local_6d0;
      uStack_258 = uStack_6c8;
      local_230 = (local_1d0 + -0.12420141) * (float)local_560;
      fStack_22c = (fStack_1cc + -0.12420141) * local_560._4_4_;
      fStack_228 = (fStack_1c8 + -0.12420141) * (float)uStack_558;
      fStack_224 = (fStack_1c4 + -0.12420141) * uStack_558._4_4_;
      local_240[0] = 0.14249323;
      local_240[1] = 0.14249323;
      afStack_238[0] = 0.14249323;
      afStack_238[1] = 0.14249323;
      local_750._4_4_ = fStack_22c + 0.14249323;
      local_750._0_4_ = local_230 + 0.14249323;
      uStack_748._0_4_ = fStack_228 + 0.14249323;
      uStack_748._4_4_ = fStack_224 + 0.14249323;
      local_2c8 = local_750;
      local_2d0 = local_6d0;
      local_2d8 = ::_ps_cephes_log_p5;
      local_2b0 = local_750;
      uStack_2a8 = uStack_748;
      local_2c0 = local_6d0;
      uStack_2b8 = uStack_6c8;
      local_290 = (local_230 + 0.14249323) * (float)local_560;
      fStack_28c = (fStack_22c + 0.14249323) * local_560._4_4_;
      fStack_288 = (fStack_228 + 0.14249323) * (float)uStack_558;
      fStack_284 = (fStack_224 + 0.14249323) * uStack_558._4_4_;
      local_2a0[0] = -0.16668057;
      local_2a0[1] = -0.16668057;
      afStack_298[0] = -0.16668057;
      afStack_298[1] = -0.16668057;
      local_750._4_4_ = fStack_28c + -0.16668057;
      local_750._0_4_ = local_290 + -0.16668057;
      uStack_748._0_4_ = fStack_288 + -0.16668057;
      uStack_748._4_4_ = fStack_284 + -0.16668057;
      local_328 = local_750;
      local_330 = local_6d0;
      local_338 = ::_ps_cephes_log_p6;
      local_310 = local_750;
      uStack_308 = uStack_748;
      local_320 = local_6d0;
      uStack_318 = uStack_6c8;
      local_2f0 = (local_290 + -0.16668057) * (float)local_560;
      fStack_2ec = (fStack_28c + -0.16668057) * local_560._4_4_;
      fStack_2e8 = (fStack_288 + -0.16668057) * (float)uStack_558;
      fStack_2e4 = (fStack_284 + -0.16668057) * uStack_558._4_4_;
      local_300[0] = 0.20000714;
      local_300[1] = 0.20000714;
      afStack_2f8[0] = 0.20000714;
      afStack_2f8[1] = 0.20000714;
      local_750._4_4_ = fStack_2ec + 0.20000714;
      local_750._0_4_ = local_2f0 + 0.20000714;
      uStack_748._0_4_ = fStack_2e8 + 0.20000714;
      uStack_748._4_4_ = fStack_2e4 + 0.20000714;
      local_388 = local_750;
      local_390 = local_6d0;
      local_398 = ::_ps_cephes_log_p7;
      local_370 = local_750;
      uStack_368 = uStack_748;
      local_380 = local_6d0;
      uStack_378 = uStack_6c8;
      local_350 = (local_2f0 + 0.20000714) * (float)local_560;
      fStack_34c = (fStack_2ec + 0.20000714) * local_560._4_4_;
      fStack_348 = (fStack_2e8 + 0.20000714) * (float)uStack_558;
      fStack_344 = (fStack_2e4 + 0.20000714) * uStack_558._4_4_;
      local_360[0] = -0.24999994;
      local_360[1] = -0.24999994;
      afStack_358[0] = -0.24999994;
      afStack_358[1] = -0.24999994;
      local_750._4_4_ = fStack_34c + -0.24999994;
      local_750._0_4_ = local_350 + -0.24999994;
      uStack_748._0_4_ = fStack_348 + -0.24999994;
      uStack_748._4_4_ = fStack_344 + -0.24999994;
      local_3e8 = local_750;
      local_3f0 = local_6d0;
      local_3f8 = ::_ps_cephes_log_p8;
      local_3d0 = local_750;
      uStack_3c8 = uStack_748;
      local_3e0 = local_6d0;
      uStack_3d8 = uStack_6c8;
      local_3b0 = (local_350 + -0.24999994) * (float)local_560;
      fStack_3ac = (fStack_34c + -0.24999994) * local_560._4_4_;
      fStack_3a8 = (fStack_348 + -0.24999994) * (float)uStack_558;
      fStack_3a4 = (fStack_344 + -0.24999994) * uStack_558._4_4_;
      local_3c0[0] = 0.3333333;
      local_3c0[1] = 0.3333333;
      afStack_3b8[0] = 0.3333333;
      afStack_3b8[1] = 0.3333333;
      local_750._4_4_ = fStack_3ac + 0.3333333;
      local_750._0_4_ = local_3b0 + 0.3333333;
      uStack_748._0_4_ = fStack_3a8 + 0.3333333;
      uStack_748._4_4_ = fStack_3a4 + 0.3333333;
      local_5e0 = local_750;
      uStack_5d8 = uStack_748;
      local_5f0 = local_6d0;
      uStack_5e8 = uStack_6c8;
      local_750._0_4_ = (local_3b0 + 0.3333333) * (float)local_560;
      local_750._4_4_ = (fStack_3ac + 0.3333333) * local_560._4_4_;
      fVar36 = (fStack_3a8 + 0.3333333) * (float)uStack_558;
      fVar37 = (fStack_3a4 + 0.3333333) * uStack_558._4_4_;
      uStack_748._0_4_ = fVar36;
      uStack_748._4_4_ = fVar37;
      local_600 = local_750;
      uStack_5f8 = uStack_748;
      local_610 = CONCAT44(fStack_73c,local_740);
      uStack_608 = CONCAT44(fStack_734,fStack_738);
      local_750._0_4_ = (float)local_750._0_4_ * local_740;
      local_750._4_4_ = (float)local_750._4_4_ * fStack_73c;
      fVar36 = fVar36 * fStack_738;
      fVar37 = fVar37 * fStack_734;
      uStack_748._0_4_ = fVar36;
      uStack_748._4_4_ = fVar37;
      local_448 = local_710;
      local_450 = ::_ps_cephes_log_q1;
      local_458 = local_750;
      local_440[0] = -0.00021219444;
      local_440[1] = -0.00021219444;
      afStack_438[0] = -0.00021219444;
      afStack_438[1] = -0.00021219444;
      local_430._0_4_ = local_710._0_4_;
      local_430._4_4_ = local_710._4_4_;
      uStack_428._0_4_ = local_710._8_4_;
      uStack_428._4_4_ = local_710._12_4_;
      local_410 = (float)local_430 * -0.00021219444;
      fStack_40c = local_430._4_4_ * -0.00021219444;
      fStack_408 = (float)uStack_428 * -0.00021219444;
      fStack_404 = uStack_428._4_4_ * -0.00021219444;
      local_420 = local_750;
      uStack_418 = uStack_748;
      local_750._4_4_ = fStack_40c + (float)local_750._4_4_;
      local_750._0_4_ = local_410 + (float)local_750._0_4_;
      uStack_748._0_4_ = fStack_408 + fVar36;
      uStack_748._4_4_ = fStack_404 + fVar37;
      local_508 = &local_740;
      local_510 = ::_ps_0p5;
      local_518 = local_750;
      local_4f0 = local_750;
      uStack_4e8 = uStack_748;
      local_4d0._4_4_ = fStack_73c;
      local_4d0._0_4_ = local_740;
      local_4d0._8_4_ = fStack_738;
      local_4d0._12_4_ = fStack_734;
      local_4e0[0] = 0.5;
      local_4e0[1] = 0.5;
      afStack_4d8[0] = 0.5;
      afStack_4d8[1] = 0.5;
      local_500 = local_740 * 0.5;
      fStack_4fc = fStack_73c * 0.5;
      fStack_4f8 = fStack_738 * 0.5;
      fStack_4f4 = fStack_734 * 0.5;
      auVar29._4_4_ = fStack_4fc;
      auVar29._0_4_ = local_500;
      auVar29._8_4_ = fStack_4f8;
      auVar29._12_4_ = fStack_4f4;
      _local_750 = vsubps_avx(_local_750,auVar29);
      local_580 = local_6d0;
      uStack_578 = uStack_6c8;
      local_590._0_4_ = local_750._0_4_;
      local_590._4_4_ = local_750._4_4_;
      uStack_588._0_4_ = local_750._8_4_;
      uStack_588._4_4_ = local_750._12_4_;
      local_6d0._4_4_ = local_560._4_4_ + local_590._4_4_;
      local_6d0._0_4_ = (float)local_560 + (float)local_590;
      uStack_6c8._0_4_ = (float)uStack_558 + (float)uStack_588;
      uStack_6c8._4_4_ = uStack_558._4_4_ + uStack_588._4_4_;
      local_4a8 = local_710;
      local_4b0 = ::_ps_cephes_log_q2;
      local_4b8 = local_6d0;
      local_490 = local_710;
      uStack_488 = uStack_708;
      local_4a0[0] = 0.6933594;
      local_4a0[1] = 0.6933594;
      afStack_498[0] = 0.6933594;
      afStack_498[1] = 0.6933594;
      local_470 = (float)local_430 * 0.6933594;
      fStack_46c = local_430._4_4_ * 0.6933594;
      fStack_468 = (float)uStack_428 * 0.6933594;
      fStack_464 = uStack_428._4_4_ * 0.6933594;
      local_480 = local_6d0;
      uStack_478 = uStack_6c8;
      local_6d0._4_4_ = fStack_46c + local_560._4_4_ + local_590._4_4_;
      local_6d0._0_4_ = local_470 + (float)local_560 + (float)local_590;
      uStack_6c8._0_4_ = fStack_468 + (float)uStack_558 + (float)uStack_588;
      uStack_6c8._4_4_ = fStack_464 + uStack_558._4_4_ + uStack_588._4_4_;
      local_80 = local_6d0;
      uStack_78 = uStack_6c8;
      local_90 = local_700._0_8_;
      uStack_88 = local_700._8_8_;
      auVar31._8_8_ = uStack_6c8;
      auVar31._0_8_ = local_6d0;
      _local_6d0 = vpor_avx(auVar31,local_700);
      local_1770 = local_6d0;
      uStack_1768 = uStack_6c8;
      local_1630 = local_16f0;
      local_1640 = local_6d0;
      uStack_1638 = uStack_6c8;
      *(undefined1 (*) [16])*local_16f0 = _local_6d0;
      local_16f0 = (undefined1 (*) [32])(*local_16f0 + 0x10);
      local_620 = ZEXT816(0) << 0x20;
      local_5c0 = local_5d0;
      uStack_5b8 = uStack_5c8;
      local_590 = local_750;
      uStack_588 = uStack_748;
      local_570 = local_730._0_8_;
      uStack_568 = local_730._8_8_;
      local_560 = uVar8;
      uStack_558 = uVar9;
      local_540 = uVar6;
      uStack_538 = uVar7;
      local_430 = local_710;
      uStack_428 = uStack_708;
      local_b0 = local_5a0;
      uStack_a8 = uStack_598;
    }
    for (; local_173c < local_16e4; local_173c = local_173c + 1) {
      local_1588 = local_16c9;
      local_1590 = local_16f0;
      fVar36 = logf(*(float *)*local_16f0);
      *(float *)*local_16f0 = fVar36;
      local_16f0 = (undefined1 (*) [32])(*local_16f0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}